

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

string * __thiscall
util::make_string<CylHead&,char_const(&)[24],unsigned_char&,char_const(&)[2]>
          (string *__return_storage_ptr__,util *this,CylHead *args,char (*args_1) [24],uchar *args_2
          ,char (*args_3) [2])

{
  size_t sVar1;
  ostringstream ss;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  fmt_abi_cxx11_(&local_1c0,"cyl %u head %u",(ulong)*(uint *)this,(ulong)*(uint *)(this + 4));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  sVar1 = strlen((char *)args);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)args,sVar1);
  std::ostream::operator<<((ostream *)local_1a0,(uint)(byte)(*args_1)[0]);
  sVar1 = strlen((char *)args_2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)args_2,sVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}